

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void __thiscall
duckdb::AggregateExecutor::
UnaryUpdate<duckdb::IntervalAvgState,duckdb::interval_t,duckdb::IntervalAverageOperation>
          (AggregateExecutor *this,Vector *input,AggregateInputData *aggr_input_data,
          data_ptr_t state,idx_t count)

{
  undefined8 *puVar1;
  long lVar2;
  ulong uVar3;
  sel_t *psVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  ulong uVar8;
  int64_t *piVar9;
  data_ptr_t pdVar10;
  FunctionData *pFVar11;
  interval_t iVar12;
  interval_t input_00;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_78;
  
  if (*this == (AggregateExecutor)0x0) {
    lVar2 = *(long *)(this + 0x20);
    FlatVector::VerifyFlatVector((Vector *)this);
    if ((data_ptr_t)0x3f < state + 0x3f) {
      uVar7 = 0;
      pdVar10 = (data_ptr_t)0x0;
      do {
        if (*(long *)(this + 0x28) == 0) {
          pdVar6 = pdVar10 + 0x40;
          if (state <= pdVar10 + 0x40) {
            pdVar6 = state;
          }
LAB_017fd9f5:
          pdVar5 = pdVar10;
          if (pdVar10 < pdVar6) {
            pFVar11 = (aggr_input_data->bind_data).ptr;
            iVar12 = *(interval_t *)&aggr_input_data->allocator;
            piVar9 = (int64_t *)((long)pdVar10 * 0x10 + lVar2 + 8);
            do {
              pFVar11 = (FunctionData *)((long)&pFVar11->_vptr_FunctionData + 1);
              (aggr_input_data->bind_data).ptr = pFVar11;
              right.micros = *piVar9;
              right._0_8_ = piVar9[-1];
              iVar12 = AddOperator::
                       Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                                 (iVar12,right);
              *(interval_t *)&aggr_input_data->allocator = iVar12;
              pdVar10 = pdVar10 + 1;
              piVar9 = piVar9 + 2;
              pdVar5 = pdVar6;
            } while (pdVar6 != pdVar10);
          }
        }
        else {
          uVar3 = *(ulong *)(*(long *)(this + 0x28) + uVar7 * 8);
          pdVar6 = pdVar10 + 0x40;
          if (state <= pdVar10 + 0x40) {
            pdVar6 = state;
          }
          if (uVar3 == 0xffffffffffffffff) goto LAB_017fd9f5;
          pdVar5 = pdVar6;
          if ((uVar3 != 0) && (pdVar5 = pdVar10, pdVar10 < pdVar6)) {
            piVar9 = (int64_t *)((long)pdVar10 * 0x10 + lVar2 + 8);
            uVar8 = 0;
            do {
              if ((uVar3 >> (uVar8 & 0x3f) & 1) != 0) {
                (aggr_input_data->bind_data).ptr =
                     (FunctionData *)
                     ((long)&((aggr_input_data->bind_data).ptr)->_vptr_FunctionData + 1);
                iVar12.micros = *piVar9;
                iVar12._0_8_ = piVar9[-1];
                iVar12 = AddOperator::
                         Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                                   (*(interval_t *)&aggr_input_data->allocator,iVar12);
                *(interval_t *)&aggr_input_data->allocator = iVar12;
              }
              uVar8 = uVar8 + 1;
              piVar9 = piVar9 + 2;
              pdVar5 = pdVar6;
            } while ((long)pdVar6 - (long)pdVar10 != uVar8);
          }
        }
        pdVar10 = pdVar5;
        uVar7 = uVar7 + 1;
      } while (uVar7 != (ulong)(state + 0x3f) >> 6);
    }
  }
  else if (*this == (AggregateExecutor)0x2) {
    if ((*(byte **)(this + 0x28) == (byte *)0x0) || ((**(byte **)(this + 0x28) & 1) != 0)) {
      puVar1 = *(undefined8 **)(this + 0x20);
      (aggr_input_data->bind_data).ptr =
           (FunctionData *)(state + (long)(aggr_input_data->bind_data).ptr);
      input_00.micros = (int64_t)state;
      input_00._0_8_ = puVar1[1];
      IntervalAdd::AddConstant<duckdb::IntervalAvgState,duckdb::interval_t>
                ((IntervalAdd *)aggr_input_data,(IntervalAvgState *)*puVar1,input_00,count);
      return;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat((Vector *)this,(idx_t)state,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (state != (data_ptr_t)0x0) {
        psVar4 = (local_78.sel)->sel_vector;
        pFVar11 = (aggr_input_data->bind_data).ptr;
        iVar12 = *(interval_t *)&aggr_input_data->allocator;
        pdVar10 = (data_ptr_t)0x0;
        do {
          pdVar6 = pdVar10;
          if (psVar4 != (sel_t *)0x0) {
            pdVar6 = (data_ptr_t)(ulong)psVar4[(long)pdVar10];
          }
          (aggr_input_data->bind_data).ptr =
               (FunctionData *)(pdVar10 + (long)((long)&pFVar11->_vptr_FunctionData + 1));
          right_01.micros = *(int64_t *)(local_78.data + (long)pdVar6 * 0x10 + 8);
          right_01._0_8_ = *(undefined8 *)(local_78.data + (long)pdVar6 * 0x10);
          iVar12 = AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                             (iVar12,right_01);
          *(interval_t *)&aggr_input_data->allocator = iVar12;
          pdVar10 = pdVar10 + 1;
        } while (state != pdVar10);
      }
    }
    else if (state != (data_ptr_t)0x0) {
      psVar4 = (local_78.sel)->sel_vector;
      pdVar10 = (data_ptr_t)0x0;
      do {
        pdVar6 = pdVar10;
        if (psVar4 != (sel_t *)0x0) {
          pdVar6 = (data_ptr_t)(ulong)psVar4[(long)pdVar10];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [(ulong)pdVar6 >> 6] >> ((ulong)pdVar6 & 0x3f) & 1) != 0)) {
          (aggr_input_data->bind_data).ptr =
               (FunctionData *)((long)&((aggr_input_data->bind_data).ptr)->_vptr_FunctionData + 1);
          right_00.micros = *(int64_t *)(local_78.data + (long)pdVar6 * 0x10 + 8);
          right_00._0_8_ = *(undefined8 *)(local_78.data + (long)pdVar6 * 0x10);
          iVar12 = AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                             (*(interval_t *)&aggr_input_data->allocator,right_00);
          *(interval_t *)&aggr_input_data->allocator = iVar12;
        }
        pdVar10 = pdVar10 + 1;
      } while (state != pdVar10);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}